

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O0

void Spl_ManStop(Spl_Man_t *p)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Spl_Man_t *p_local;
  
  Gia_ManStaticFanoutStop(p->pGia);
  iVar1 = Gia_ManHasMapping(p->pGia);
  if (iVar1 != 0) {
    __assert_fail("!Gia_ManHasMapping(p->pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSplit.c"
                  ,0x99,"void Spl_ManStop(Spl_Man_t *)");
  }
  iVar1 = Gia_ManHasMapping2(p->pGia);
  if (iVar1 == 0) {
    __assert_fail("Gia_ManHasMapping2(p->pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSplit.c"
                  ,0x9a,"void Spl_ManStop(Spl_Man_t *)");
  }
  pVVar2 = Spl_ManFromWecMapping(p->pGia,p->pGia->vMapping2);
  p->pGia->vMapping = pVVar2;
  Vec_WecFreeP(&p->pGia->vMapping2);
  Vec_BitFree(p->vMarksCIO);
  Vec_BitFree(p->vMarksIn);
  Vec_BitFree(p->vMarksNo);
  Vec_BitFree(p->vMarksAnd);
  Vec_IntFree(p->vRoots);
  Vec_IntFree(p->vNodes);
  Vec_IntFree(p->vLeaves);
  Vec_IntFree(p->vAnds);
  Vec_IntFree(p->vFanouts);
  Vec_IntFree(p->vCands);
  Vec_IntFree(p->vInputs);
  if (p != (Spl_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Spl_ManStop( Spl_Man_t * p )
{
    // fanout
    Gia_ManStaticFanoutStop( p->pGia );
    // mapping
    assert( !Gia_ManHasMapping(p->pGia) );
    assert( Gia_ManHasMapping2(p->pGia) );
    p->pGia->vMapping = Spl_ManFromWecMapping( p->pGia, p->pGia->vMapping2 );
    Vec_WecFreeP( &p->pGia->vMapping2 );
    // intermediate
    Vec_BitFree( p->vMarksCIO );
    Vec_BitFree( p->vMarksIn );
    Vec_BitFree( p->vMarksNo );
    Vec_BitFree( p->vMarksAnd );
    Vec_IntFree( p->vRoots );
    Vec_IntFree( p->vNodes );
    Vec_IntFree( p->vLeaves );
    Vec_IntFree( p->vAnds );
    // temporary 
    Vec_IntFree( p->vFanouts );
    Vec_IntFree( p->vCands );
    Vec_IntFree( p->vInputs );
    ABC_FREE( p );
}